

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O1

int32_t __thiscall
icu_63::CollationRuleParser::parseRelationOperator(CollationRuleParser *this,UErrorCode *errorCode)

{
  ushort uVar1;
  UnicodeString *pUVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  char16_t *pcVar6;
  uint uVar7;
  char16_t cVar8;
  bool bVar9;
  
  uVar5 = 0xffffffff;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    uVar3 = skipWhiteSpace(this,this->ruleIndex);
    this->ruleIndex = uVar3;
    pUVar2 = this->rules;
    uVar1 = (pUVar2->fUnion).fStackFields.fLengthAndFlags;
    if ((short)uVar1 < 0) {
      uVar7 = (pUVar2->fUnion).fFields.fLength;
    }
    else {
      uVar7 = (int)(short)uVar1 >> 5;
    }
    if ((int)uVar3 < (int)uVar7) {
      cVar8 = L'\xffff';
      if (uVar3 < uVar7) {
        if ((uVar1 & 2) == 0) {
          pcVar6 = (pUVar2->fUnion).fFields.fArray;
        }
        else {
          pcVar6 = (char16_t *)((long)&pUVar2->fUnion + 2);
        }
        cVar8 = pcVar6[(int)uVar3];
      }
      uVar4 = uVar3 + 1;
      if ((ushort)cVar8 < 0x3c) {
        if (cVar8 == L',') {
          uVar5 = 2;
        }
        else {
          uVar5 = 1;
          if (cVar8 != L';') {
            return -1;
          }
        }
      }
      else if (cVar8 == L'=') {
        uVar5 = 0xf;
        if ((int)uVar4 < (int)uVar7) {
          if (uVar4 < uVar7) {
            if ((uVar1 & 2) == 0) {
              pcVar6 = (pUVar2->fUnion).fFields.fArray;
            }
            else {
              pcVar6 = (char16_t *)((long)&pUVar2->fUnion + 2);
            }
            bVar9 = pcVar6[(int)uVar4] == L'*';
          }
          else {
            bVar9 = false;
          }
          uVar5 = (uint)bVar9 << 4 | 0xf;
          if (bVar9 != false) {
            uVar4 = uVar3 + 2;
          }
        }
      }
      else {
        if (cVar8 != L'<') {
          return -1;
        }
        uVar5 = 0;
        if (uVar4 < uVar7 && (int)uVar4 < (int)uVar7) {
          if ((uVar1 & 2) == 0) {
            pcVar6 = (pUVar2->fUnion).fFields.fArray;
          }
          else {
            pcVar6 = (char16_t *)((long)&pUVar2->fUnion + 2);
          }
          uVar5 = 0;
          if (pcVar6[(int)uVar4] == L'<') {
            uVar4 = uVar3 + 2;
            uVar5 = 1;
            if (uVar4 < uVar7 && (int)uVar4 < (int)uVar7) {
              if ((uVar1 & 2) == 0) {
                pcVar6 = (pUVar2->fUnion).fFields.fArray;
              }
              else {
                pcVar6 = (char16_t *)((long)&pUVar2->fUnion + 2);
              }
              if (pcVar6[(int)uVar4] == L'<') {
                uVar4 = uVar3 + 3;
                uVar5 = 2;
                if ((int)uVar4 < (int)uVar7) {
                  if (uVar4 < uVar7) {
                    if ((uVar1 & 2) == 0) {
                      pcVar6 = (pUVar2->fUnion).fFields.fArray;
                    }
                    else {
                      pcVar6 = (char16_t *)((long)&pUVar2->fUnion + 2);
                    }
                    bVar9 = pcVar6[(int)uVar4] == L'<';
                  }
                  else {
                    bVar9 = false;
                  }
                  uVar5 = bVar9 + 2;
                  if (bVar9 != false) {
                    uVar4 = uVar3 + 4;
                  }
                }
              }
            }
          }
        }
        if (uVar4 < uVar7 && (int)uVar4 < (int)uVar7) {
          if ((uVar1 & 2) == 0) {
            pcVar6 = (pUVar2->fUnion).fFields.fArray;
          }
          else {
            pcVar6 = (char16_t *)((long)&pUVar2->fUnion + 2);
          }
          if (pcVar6[(int)uVar4] == L'*') {
            uVar5 = uVar5 | 0x10;
            uVar4 = uVar4 + 1;
          }
        }
      }
      uVar5 = (uVar4 - uVar3) * 0x100 | uVar5;
    }
  }
  return uVar5;
}

Assistant:

int32_t
CollationRuleParser::parseRelationOperator(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return UCOL_DEFAULT; }
    ruleIndex = skipWhiteSpace(ruleIndex);
    if(ruleIndex >= rules->length()) { return UCOL_DEFAULT; }
    int32_t strength;
    int32_t i = ruleIndex;
    UChar c = rules->charAt(i++);
    switch(c) {
    case 0x3c:  // '<'
        if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<
            ++i;
            if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<<
                ++i;
                if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<<<
                    ++i;
                    strength = UCOL_QUATERNARY;
                } else {
                    strength = UCOL_TERTIARY;
                }
            } else {
                strength = UCOL_SECONDARY;
            }
        } else {
            strength = UCOL_PRIMARY;
        }
        if(i < rules->length() && rules->charAt(i) == 0x2a) {  // '*'
            ++i;
            strength |= STARRED_FLAG;
        }
        break;
    case 0x3b:  // ';' same as <<
        strength = UCOL_SECONDARY;
        break;
    case 0x2c:  // ',' same as <<<
        strength = UCOL_TERTIARY;
        break;
    case 0x3d:  // '='
        strength = UCOL_IDENTICAL;
        if(i < rules->length() && rules->charAt(i) == 0x2a) {  // '*'
            ++i;
            strength |= STARRED_FLAG;
        }
        break;
    default:
        return UCOL_DEFAULT;
    }
    return ((i - ruleIndex) << OFFSET_SHIFT) | strength;
}